

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Texture
          (FormattingScene *this,string *name,string *type,string *texname,
          ParsedParameterVector params,FileLoc loc)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  double *pdVar2;
  FormattingScene *this_01;
  string *args_1;
  string *__lhs_00;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  undefined8 uVar8;
  ostream *poVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *args;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar10;
  long lVar11;
  char *pcVar12;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long lVar14;
  Float FVar15;
  string local_1b0;
  FormattingScene *local_190;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_188;
  string *local_180;
  string local_178;
  string *local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tri;
  Float gamma;
  ulong local_128;
  string *local_120;
  string extra;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_90;
  
  local_188 = in_R8;
  local_180 = type;
  if (this->upgrade == true) {
    this_00 = &this->definedTextures;
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this_00,name);
    if (iVar6._M_node == (_Base_ptr)&this->field_0x20) {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,name);
      std::__cxx11::string::_M_assign((string *)pmVar7);
    }
    else {
      Warning<std::__cxx11::string_const&>
                ((FileLoc *)&params,"%s: renaming multiply-defined texture",name);
      extra._M_dataplus._M_p._0_4_ = Texture::count;
      Texture::count = Texture::count + 1;
      StringPrintf<std::__cxx11::string_const&,int>
                ((string *)&dict,(pbrt *)"%s-renamed-%d",(char *)name,&extra,(int *)in_R8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,name);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&dict);
      std::__cxx11::string::~string((string *)&dict);
    }
  }
  local_190 = this;
  local_158 = name;
  local_120 = texname;
  if ((this->upgrade == true) && (bVar3 = std::operator==(texname,"scale"), bVar3)) {
    bVar3 = std::operator==(local_180,"float");
    paVar10 = &local_188->field_2;
    if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
         *)local_188->ptr !=
        (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
         *)0x0) {
      paVar10 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)local_188->ptr;
    }
    lVar11 = local_188->nStored << 3;
    if (bVar3) {
      for (lVar14 = 0; lVar11 != lVar14; lVar14 = lVar14 + 8) {
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (*(long *)((long)paVar10 + lVar14) + 0x20);
        bVar3 = std::operator==(pbVar13,"tex1");
        if (bVar3) {
          std::__cxx11::string::assign((char *)pbVar13);
        }
        bVar3 = std::operator==(pbVar13,"tex2");
        if (bVar3) {
          std::__cxx11::string::assign((char *)pbVar13);
        }
      }
    }
    else {
      bVar3 = false;
      local_128 = 0;
      for (lVar14 = 0; lVar11 != lVar14; lVar14 = lVar14 + 8) {
        __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 ((long)paVar10 + lVar14);
        pbVar13 = __lhs + 1;
        bVar4 = std::operator!=(pbVar13,"tex1");
        if ((!bVar4) || (bVar4 = std::operator!=(pbVar13,"tex2"), !bVar4)) {
          bVar4 = std::operator==(__lhs,"rgb");
          if (bVar4) {
            if (bVar3) {
              pcVar12 = 
              "Two \"rgb\" textures found for \"scale\" texture \"%s\". Please manually edit the file to upgrade."
              ;
LAB_0037c928:
              (local_190->super_SceneRepresentation).errorExit = true;
              Error<std::__cxx11::string_const&>((FileLoc *)(__lhs + 2),pcVar12,local_158);
              return;
            }
            if (__lhs[3].field_2._M_allocated_capacity != 3) {
              pcVar12 = "Didn\'t find 3 values for \"rgb\" \"%s\".";
              goto LAB_0037c94b;
            }
            pdVar2 = (double *)__lhs[3]._M_dataplus._M_p;
            dVar1 = pdVar2[1];
            if (*pdVar2 == dVar1) {
              if ((dVar1 == pdVar2[2]) && (!NAN(dVar1) && !NAN(pdVar2[2]))) {
                std::__cxx11::string::assign((char *)__lhs);
                std::__cxx11::string::assign((char *)pbVar13);
                pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::resize
                          ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)
                           ((long)&__lhs[2].field_2 + 8),1);
                bVar3 = true;
                goto LAB_0037c3f6;
              }
            }
            pcVar12 = 
            "Non-constant \"rgb\" value found for \"scale\" texture parameter \"%s\". Please manually edit the file to upgrade."
            ;
LAB_0037c94b:
            (local_190->super_SceneRepresentation).errorExit = true;
            Error<std::__cxx11::string&>((FileLoc *)(__lhs + 2),pcVar12,pbVar13);
            return;
          }
          if ((local_128 & 1) != 0) {
            pcVar12 = 
            "Two textures found for \"scale\" texture \"%s\". Please manually edit the file to upgrade."
            ;
            goto LAB_0037c928;
          }
          uVar8 = std::__cxx11::string::assign((char *)pbVar13);
          local_128 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
        }
LAB_0037c3f6:
      }
    }
  }
  extra._M_dataplus._M_p = (pointer)pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_90,local_188,(polymorphic_allocator<pbrt::ParsedParameter_*> *)&extra);
  ParameterDictionary::ParameterDictionary(&dict,&local_90,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_90);
  __lhs_00 = local_120;
  this_01 = local_190;
  bVar5 = local_190->upgrade;
  if ((bool)bVar5 == true) {
    ParameterDictionary::RenameUsedTextures(&dict,&local_190->definedTextures);
    bVar5 = this_01->upgrade;
  }
  args_1 = local_158;
  args = &extra.field_2;
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  extra._M_dataplus._M_p = (pointer)args;
  if ((bVar5 & 1) != 0) {
    bVar3 = std::operator==(__lhs_00,"imagemap");
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"trilinear",(allocator<char> *)&local_178);
      ParameterDictionary::GetBoolArray(&tri,&dict,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      if ((long)tri.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)tri.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"trilinear",(allocator<char> *)&local_178);
        ParameterDictionary::RemoveBool(&dict,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        indent_abi_cxx11_(&local_178,this_01,1);
        std::operator+(&local_1b0,&local_178,"\"string filter\" ");
        std::__cxx11::string::append((string *)&extra);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::append((char *)&extra);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&tri.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    bVar3 = std::operator==(__lhs_00,"imagemap");
    if ((bVar3) || (bVar3 = std::operator==(__lhs_00,"ptex"), bVar3)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"gamma",(allocator<char> *)&local_178);
      FVar15 = ParameterDictionary::GetOneFloat(&dict,&local_1b0,0.0);
      local_188 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)CONCAT44(local_188._4_4_,FVar15);
      std::__cxx11::string::~string((string *)&local_1b0);
      gamma = local_188._0_4_;
      if ((local_188._0_4_ != 0.0) || (NAN(local_188._0_4_))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"gamma",(allocator<char> *)&local_178);
        ParameterDictionary::RemoveFloat(&dict,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        indent_abi_cxx11_(&local_178,this_01,1);
        StringPrintf<float&>
                  ((string *)&tri,(pbrt *)"\"string encoding \" \"gamma %f\" ",(char *)&gamma,
                   (float *)args);
        std::operator+(&local_1b0,&local_178,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tri);
        std::__cxx11::string::append((string *)&extra);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&tri);
        std::__cxx11::string::~string((string *)&local_178);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"gamma",(allocator<char> *)&local_178);
        ParameterDictionary::GetBoolArray(&tri,&dict,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        if ((long)tri.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)tri.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start == 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"gamma",(allocator<char> *)&local_178);
          ParameterDictionary::RemoveBool(&dict,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          indent_abi_cxx11_(&local_178,this_01,1);
          std::operator+(&local_1b0,&local_178,"\"string encoding\" ");
          std::__cxx11::string::append((string *)&extra);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::append((char *)&extra);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&tri.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
    }
  }
  if (this_01->upgrade == true) {
    bVar3 = std::operator==(local_180,"color");
    if (bVar3) {
      indent_abi_cxx11_(&local_1b0,this_01,0);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_01->definedTextures,args_1);
      Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&>
                ("%sTexture \"%s\" \"spectrum\" \"%s\"\n",&local_1b0,pmVar7,__lhs_00);
    }
    else {
      indent_abi_cxx11_(&local_1b0,this_01,0);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_01->definedTextures,args_1);
      Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ("%sTexture \"%s\" \"%s\" \"%s\"\n",&local_1b0,pmVar7,local_180,__lhs_00);
    }
  }
  else {
    indent_abi_cxx11_(&local_1b0,this_01,0);
    Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ("%sTexture \"%s\" \"%s\" \"%s\"\n",&local_1b0,args_1,local_180,__lhs_00);
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar9 = std::operator<<((ostream *)&std::cout,(string *)&extra);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_1b0,&dict,*(int *)&(this_01->super_SceneRepresentation).field_0xc);
  std::operator<<(poVar9,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&extra);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::Texture(const std::string &name, const std::string &type,
                              const std::string &texname, ParsedParameterVector params,
                              FileLoc loc) {
    if (upgrade) {
        if (definedTextures.find(name) != definedTextures.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined texture", name);
            definedTextures[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedTextures[name] = name;
    }

    if (upgrade && texname == "scale") {
        // This is easier to do in the raw ParsedParameterVector...
        if (type == "float") {
            for (ParsedParameter *p : params) {
                if (p->name == "tex1")
                    p->name = "tex";
                if (p->name == "tex2")
                    p->name = "scale";
            }
        } else {
            // more subtle: rename one of them as float, but need one of them
            // to be an RGB and spectrally constant...
            bool foundRGB = false, foundTexture = false;
            for (ParsedParameter *p : params) {
                if (p->name != "tex1" && p->name != "tex2")
                    continue;

                if (p->type == "rgb") {
                    if (foundRGB) {
                        ErrorExitDeferred(
                            &p->loc,
                            "Two \"rgb\" textures found for \"scale\" "
                            "texture \"%s\". Please manually edit the file to "
                            "upgrade.",
                            name);
                        return;
                    }
                    if (p->numbers.size() != 3) {
                        ErrorExitDeferred(
                            &p->loc, "Didn't find 3 values for \"rgb\" \"%s\".", p->name);
                        return;
                    }
                    if (p->numbers[0] != p->numbers[1] ||
                        p->numbers[1] != p->numbers[2]) {
                        ErrorExitDeferred(&p->loc,
                                          "Non-constant \"rgb\" value found for "
                                          "\"scale\" texture parameter \"%s\". Please "
                                          "manually "
                                          "edit the file to upgrade.",
                                          p->name);
                        return;
                    }

                    foundRGB = true;
                    p->type = "float";
                    p->name = "scale";
                    p->numbers.resize(1);
                } else {
                    if (foundTexture) {
                        ErrorExitDeferred(
                            &p->loc,
                            "Two textures found for \"scale\" "
                            "texture \"%s\". Please manually edit the file to "
                            "upgrade.",
                            name);
                        return;
                    }
                    p->name = "tex";
                    foundTexture = true;
                }
            }
        }
    }

    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade)
        dict.RenameUsedTextures(definedTextures);

    std::string extra;
    if (upgrade) {
        if (texname == "imagemap") {
            std::vector<uint8_t> tri = dict.GetBoolArray("trilinear");
            if (tri.size() == 1) {
                dict.RemoveBool("trilinear");
                extra += indent(1) + "\"string filter\" ";
                extra += tri[0] != 0u ? "\"trilinear\"\n" : "\"bilinear\"\n";
            }
        }

        if (texname == "imagemap" || texname == "ptex") {
            Float gamma = dict.GetOneFloat("gamma", 0);
            if (gamma != 0) {
                dict.RemoveFloat("gamma");
                extra +=
                    indent(1) + StringPrintf("\"string encoding \" \"gamma %f\" ", gamma);
            } else {
                std::vector<uint8_t> gamma = dict.GetBoolArray("gamma");
                if (gamma.size() == 1) {
                    dict.RemoveBool("gamma");
                    extra += indent(1) + "\"string encoding\" ";
                    extra += gamma[0] != 0u ? "\"sRGB\"\n" : "\"linear\"\n";
                }
            }
        }
    }

    if (upgrade) {
        if (type == "color")
            Printf("%sTexture \"%s\" \"spectrum\" \"%s\"\n", indent(),
                   definedTextures[name], texname);
        else
            Printf("%sTexture \"%s\" \"%s\" \"%s\"\n", indent(), definedTextures[name],
                   type, texname);
    } else
        Printf("%sTexture \"%s\" \"%s\" \"%s\"\n", indent(), name, type, texname);

    std::cout << extra << dict.ToParameterList(catIndentCount);
}